

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS ref_agents_delete(REF_AGENTS ref_agents,REF_INT node)

{
  int iVar1;
  uint uVar2;
  REF_STATUS RVar3;
  long lVar4;
  long lVar5;
  
  if (node < 0) {
    RVar3 = 3;
  }
  else {
    iVar1 = ref_agents->max;
    if (0 < iVar1) {
      lVar4 = 0x10;
      lVar5 = 0;
      do {
        if ((*(int *)((long)ref_agents->agent->xyz + lVar4 + -0x40) != 0) &&
           (*(int *)((long)ref_agents->agent->xyz + lVar4 + -0x30) == node)) {
          uVar2 = ref_agents_remove(ref_agents,(REF_INT)lVar5);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                   ,0xe8,"ref_agents_delete",(ulong)uVar2,"rm");
            return uVar2;
          }
          iVar1 = ref_agents->max;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x68;
      } while (lVar5 < iVar1);
    }
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_agents_delete(REF_AGENTS ref_agents, REF_INT node) {
  REF_INT id;

  if (node < 0) return REF_INVALID;

  each_active_ref_agent(ref_agents, id) {
    if (node == ref_agent_node(ref_agents, id))
      RSS(ref_agents_remove(ref_agents, id), "rm");
  }

  return REF_SUCCESS;
}